

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

void * LZ4_createHC(char *inputBuffer)

{
  LZ4_streamHC_t *hc4;
  char *inputBuffer_local;
  
  inputBuffer_local = (char *)LZ4_createStreamHC();
  if ((LZ4_streamHC_t *)inputBuffer_local == (LZ4_streamHC_t *)0x0) {
    inputBuffer_local = (char *)0x0;
  }
  else {
    LZ4HC_init_internal((LZ4HC_CCtx_internal *)inputBuffer_local,(BYTE *)inputBuffer);
  }
  return inputBuffer_local;
}

Assistant:

void* LZ4_createHC (const char* inputBuffer)
{
    LZ4_streamHC_t* const hc4 = LZ4_createStreamHC();
    if (hc4 == NULL) return NULL;   /* not enough memory */
    LZ4HC_init_internal (&hc4->internal_donotuse, (const BYTE*)inputBuffer);
    return hc4;
}